

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools.cxx
# Opt level: O0

void __thiscall level_tools::~level_tools(level_tools *this)

{
  xr_ini_file *this_00;
  level_tools *this_local;
  
  (this->super_tools_base)._vptr_tools_base = (_func_int **)&PTR__level_tools_00389120;
  (this->super_xr_surface_factory)._vptr_xr_surface_factory =
       (_func_int **)&PTR__level_tools_00389150;
  this_00 = this->m_ini;
  if (this_00 != (xr_ini_file *)0x0) {
    xray_re::xr_ini_file::~xr_ini_file(this_00);
    operator_delete(this_00,0x18);
  }
  if (this->m_shaders_xrlc_lib != (xr_shaders_xrlc_lib *)0x0) {
    (*this->m_shaders_xrlc_lib->_vptr_xr_shaders_xrlc_lib[1])();
  }
  if (this->m_scene != (xr_scene *)0x0) {
    (*this->m_scene->_vptr_xr_scene[1])();
  }
  if (this->m_level != (xr_level *)0x0) {
    (*this->m_level->_vptr_xr_level[1])();
  }
  std::__cxx11::string::~string((string *)&this->m_objects_ref);
  std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::~vector(&this->m_mu_models);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector(&this->m_uniq_shaders);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector(&this->m_uniq_textures);
  xray_re::xr_surface_factory::~xr_surface_factory(&this->super_xr_surface_factory);
  tools_base::~tools_base(&this->super_tools_base);
  return;
}

Assistant:

level_tools::~level_tools()
{
	delete m_ini;
	delete m_shaders_xrlc_lib;
	delete m_scene;
	delete m_level;
}